

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_map_reduce.h
# Opt level: O0

tuple<int_&,_double_&>
omp::details::
tuple_map_<0ul,1ul,omp_tuple_map_pair_one_pair_ref_Test::TestBody()::__0,std::pair<int,double>&>
          (_Tuple_impl<1UL,_double_&> param_1,anon_class_1_0_00000001 *param_2,
          pair<int,_double> *param_3)

{
  int *__a1;
  double *__a2;
  _Head_base<0UL,_int_&,_false> extraout_RDX;
  tuple<int_&,_double_&> tVar1;
  pair<int,_double> *tups_local;
  anon_class_1_0_00000001 *call_local;
  
  __a1 = map_one<0ul,omp_tuple_map_pair_one_pair_ref_Test::TestBody()::__0,std::pair<int,double>&>
                   (param_2,param_3);
  __a2 = map_one<1ul,omp_tuple_map_pair_one_pair_ref_Test::TestBody()::__0,std::pair<int,double>&>
                   (param_2,param_3);
  std::tuple<int_&,_double_&>::tuple<true,_true>
            ((tuple<int_&,_double_&> *)param_1.super__Head_base<1UL,_double_&,_false>._M_head_impl,
             __a1,__a2);
  tVar1.super__Tuple_impl<0UL,_int_&,_double_&>.super__Head_base<0UL,_int_&,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  tVar1.super__Tuple_impl<0UL,_int_&,_double_&>.super__Tuple_impl<1UL,_double_&>.
  super__Head_base<1UL,_double_&,_false>._M_head_impl =
       param_1.super__Head_base<1UL,_double_&,_false>._M_head_impl;
  return (tuple<int_&,_double_&>)tVar1.super__Tuple_impl<0UL,_int_&,_double_&>;
}

Assistant:

constexpr auto tuple_map_(std::index_sequence<Idxs...>, Callable &&call,
                          Tuples &&...tups) {
  return std::tuple<decltype(map_one<Idxs>(std::forward<Callable>(call),
                                           std::forward<Tuples>(tups)...))...>(
      map_one<Idxs>(std::forward<Callable>(call),
                    std::forward<Tuples>(tups)...)...);
}